

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void CloseWSRStream(CManager cm,void *WSR_Stream_v)

{
  SstStream s;
  int iVar1;
  WS_ReaderInfo in_RSI;
  SstStream ParentStream;
  WS_ReaderInfo CP_WSR_Stream;
  WS_ReaderInfo CP_WSR_Stream_00;
  
  s = in_RSI->ParentStream;
  CP_WSR_Stream_00 = in_RSI;
  pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
  CP_verbose(s,PerRankVerbose,"Delayed task Moving Reader stream %p to status %s\n",in_RSI,
             SSTStreamStatusStr[3]);
  CP_PeerFailCloseWSReader(CP_WSR_Stream_00,(StreamStatus)((ulong)in_RSI >> 0x20));
  iVar1 = strncmp("mpi",s->ConfigParams->DataTransport,3);
  if ((iVar1 == 0) && (in_RSI->DP_WSR_Stream != (void *)0x0)) {
    (*in_RSI->ParentStream->DP_Interface->destroyWriterPerReader)(&Svcs,in_RSI->DP_WSR_Stream);
    in_RSI->DP_WSR_Stream = (void *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
  return;
}

Assistant:

static void CloseWSRStream(CManager cm, void *WSR_Stream_v)
{
    WS_ReaderInfo CP_WSR_Stream = (WS_ReaderInfo)WSR_Stream_v;
    SstStream ParentStream = CP_WSR_Stream->ParentStream;

    STREAM_MUTEX_LOCK(ParentStream);
    CP_verbose(ParentStream, PerRankVerbose, "Delayed task Moving Reader stream %p to status %s\n",
               (void *)CP_WSR_Stream, SSTStreamStatusStr[PeerClosed]);
    CP_PeerFailCloseWSReader(CP_WSR_Stream, PeerClosed);

    if (strncmp("mpi", ParentStream->ConfigParams->DataTransport, 3) == 0 &&
        CP_WSR_Stream->DP_WSR_Stream)
    {
        CP_WSR_Stream->ParentStream->DP_Interface->destroyWriterPerReader(
            &Svcs, CP_WSR_Stream->DP_WSR_Stream);
        CP_WSR_Stream->DP_WSR_Stream = NULL;
    }
    STREAM_MUTEX_UNLOCK(ParentStream);
}